

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

void __thiscall IR::Instr::MoveArgs(Instr *this,bool generateByteCodeCapture)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  StackSym *pSVar5;
  SymOpnd *pSVar6;
  Instr *this_00;
  Instr *pIVar7;
  Instr *pIVar8;
  
  OVar1 = this->m_opcode;
  if ((((OVar1 != CallI) && (OVar1 != CallDirect)) && (OVar1 != InlineeStart)) &&
     (OVar1 != CallIFixed)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xd81,
                       "(this->m_opcode == Js::OpCode::InlineeStart || this->m_opcode == Js::OpCode::CallDirect || this->m_opcode == Js::OpCode::CallI || this->m_opcode == Js::OpCode::CallIFixed)"
                       ,
                       "this->m_opcode == Js::OpCode::InlineeStart || this->m_opcode == Js::OpCode::CallDirect || this->m_opcode == Js::OpCode::CallI || this->m_opcode == Js::OpCode::CallIFixed"
                      );
    if (!bVar3) goto LAB_00484c9e;
    *puVar4 = 0;
  }
  pSVar5 = Opnd::GetStackSym(this->m_src2);
  this_00 = (pSVar5->field_5).m_instrDef;
  pIVar8 = this;
  if ((this_00 != (Instr *)0x0 & pSVar5->field_0x18) == 1) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar3) {
LAB_00484c9e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    this_00 = (pSVar5->field_5).m_instrDef;
  }
  do {
    if ((this_00->m_src2 == (Opnd *)0x0) || (bVar3 = Opnd::IsSymOpnd(this_00->m_src2), !bVar3)) {
LAB_00484c11:
      pIVar7 = (Instr *)0x0;
    }
    else {
      pSVar6 = Opnd::AsSymOpnd(this_00->m_src2);
      pSVar5 = Sym::AsStackSym(pSVar6->m_sym);
      bVar3 = StackSym::IsArgSlotSym(pSVar5);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar3) goto LAB_00484c9e;
        *puVar4 = 0;
      }
      if ((((pSVar5->field_0x18 & 1) == 0) || ((pSVar5->field_5).m_instrDef == (Instr *)0x0)) &&
         ((bVar3 = Func::IsInPhase(this->m_func,FGPeepsPhase), !bVar3 &&
          (bVar3 = Func::IsInPhase(this->m_func,FGBuildPhase), !bVar3)))) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1bf,
                           "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                           ,
                           "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                          );
        if (!bVar3) goto LAB_00484c9e;
        *puVar4 = 0;
      }
      if ((pSVar5->field_0x18 & 1) == 0) goto LAB_00484c11;
      pIVar7 = (pSVar5->field_5).m_instrDef;
    }
    if (this_00->m_opcode != ArgOut_A_InlineSpecialized) {
      if (this_00->m_opcode == StartCall) {
        if (pIVar7 == (Instr *)0x0) {
          return;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
        if (bVar3) {
          *puVar4 = 0;
          return;
        }
        goto LAB_00484c9e;
      }
      if (generateByteCodeCapture) {
        GenerateBytecodeArgOutCapture(this_00);
      }
      Move(this_00,pIVar8);
      pIVar8 = this_00;
    }
    this_00 = pIVar7;
    if (pIVar7 == (Instr *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void Instr::MoveArgs(bool generateByteCodeCapture)
{
    Assert(this->m_opcode == Js::OpCode::InlineeStart || this->m_opcode == Js::OpCode::CallDirect ||
        this->m_opcode == Js::OpCode::CallI || this->m_opcode == Js::OpCode::CallIFixed);
    IR::Instr *argInsertInstr = this;
    this->IterateArgInstrs([&](IR::Instr* argInstr)
    {
        if (generateByteCodeCapture)
        {
            argInstr->GenerateBytecodeArgOutCapture();
        }
        argInstr->Move(argInsertInstr);
        argInsertInstr = argInstr;
        return false;
    });
}